

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::Run(StringTest *this)

{
  StringTest *this_local;
  
  switch(this->mTestNum) {
  case 0:
    Test1(this);
    break;
  case 1:
    Test2(this);
    break;
  case 2:
    Test3(this);
    break;
  case 3:
    Test4(this);
    break;
  case 4:
    Test5(this);
    break;
  case 5:
    Test6(this);
    break;
  case 6:
    Test7(this);
    break;
  case 7:
    Test8(this);
    break;
  case 8:
    Test9(this);
    break;
  case 9:
    Test10(this);
    break;
  case 10:
    Test11(this);
    break;
  case 0xb:
    Test12(this);
  }
  return;
}

Assistant:

void Run()
	{	
		switch( mTestNum )
		{
		case 0:
			Test1();
			break;
		case 1:
			Test2();
			break;
		case 2:
			Test3();
			break;
		case 3:
			Test4();
			break;
		case 4:
			Test5();
			break;
		case 5:
			Test6();
			break;
		case 6:
			Test7();
			break;
		case 7:
			Test8();
			break;
		case 8:
			Test9();
			break;
		case 9:
			Test10();
			break;
		case 10:
			Test11();
			break;
		case 11:
			Test12();
			break;
		default:
			break;
		}
	}